

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O3

double __thiscall embree::Application::log(Application *this,double __x)

{
  double dVar1;
  size_t sVar2;
  size_t sVar3;
  ostream *poVar4;
  long lVar5;
  undefined8 *in_RDX;
  double *pdVar6;
  int in_ESI;
  long lVar7;
  bool bVar8;
  
  if (in_ESI <= this->verbosity) {
    __x = getSeconds();
    sVar2 = getVirtualMemoryBytes();
    sVar3 = getResidentMemoryBytes();
    bVar8 = this->log_delta != false;
    pdVar6 = &this->start_time;
    if (bVar8) {
      pdVar6 = &this->last_time;
    }
    dVar1 = *pdVar6;
    lVar5 = this->last_virtual_memory;
    if (!bVar8) {
      lVar5 = 0;
    }
    lVar7 = 0;
    if (bVar8) {
      lVar7 = this->last_resident_memory;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[ ",2);
    *(undefined8 *)(__cxa_call_unexpected + *(long *)(std::cout + -0x18)) = 8;
    *(undefined8 *)(&std::bad_alloc::typeinfo + *(long *)(std::cout + -0x18)) = 3;
    *(uint *)(operator_delete__ + *(long *)(std::cout + -0x18)) =
         *(uint *)(operator_delete__ + *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
    poVar4 = std::ostream::_M_insert<double>(__x - dVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"s, ",3);
    *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 8;
    *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 8) = 2;
    *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xfffffefb | 4;
    poVar4 = std::ostream::_M_insert<double>((double)(long)(sVar2 - lVar5) / 1000000.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," MB virtual, ",0xd);
    *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 8;
    *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 8) = 2;
    *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xfffffefb | 4;
    poVar4 = std::ostream::_M_insert<double>((double)(long)(sVar3 - lVar7) / 1000000.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," MB resident ] ",0xf);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)*in_RDX,in_RDX[1]);
    *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xfffffefb | 4;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::ostream::flush();
    this->last_time = __x;
    this->last_virtual_memory = sVar2;
    this->last_resident_memory = sVar3;
  }
  return __x;
}

Assistant:

void Application::log(int verbose, const std::string& str)
  {
    if (verbosity < verbose)
      return;
    
    double time = getSeconds();
    ssize_t virtual_memory = getVirtualMemoryBytes();
    ssize_t resident_memory = getResidentMemoryBytes();

    double log_time = log_delta ? time-last_time : time-start_time;
    ssize_t log_virtual_memory = log_delta ? virtual_memory-last_virtual_memory : virtual_memory;
    ssize_t log_resident_memory = log_delta ? resident_memory-last_resident_memory : resident_memory;
      
    std::cout << "[ "
              << std::setw(8) << std::setprecision(3) << std::fixed << log_time << "s, "
              << std::setw(8) << std::setprecision(2) << std::fixed << double(log_virtual_memory)/1E6 << " MB virtual, "
              << std::setw(8) << std::setprecision(2) << std::fixed << double(log_resident_memory)/1E6 << " MB resident ] "
              << str << std::fixed 
              << std::endl << std::flush;
    
    last_time = time;
    last_virtual_memory = virtual_memory;
    last_resident_memory = resident_memory;
  }